

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O0

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateFile(HtmlparserCppTest *this,string *filename)

{
  FILE *__stream;
  int iVar1;
  undefined8 uVar2;
  char *filename_00;
  string local_1c8 [8];
  string annotation_block;
  string local_1a8 [8];
  string html_block;
  long local_188;
  size_t end_annotation;
  size_t start_annotation;
  size_t start_html;
  string buffer;
  string local_150 [8];
  string fullpath;
  allocator local_129;
  string local_128 [32];
  string local_108 [39];
  allocator local_e1;
  string local_e0 [32];
  string local_c0 [39];
  allocator local_99;
  string local_98 [55];
  allocator local_61;
  string local_60 [32];
  string local_40 [8];
  string dir;
  char *local_20;
  char *template_rootdir;
  string *filename_local;
  HtmlparserCppTest *this_local;
  
  local_20 = getenv("TEMPLATE_ROOTDIR");
  if (local_20 == (char *)0x0) {
    local_20 = ".";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,local_20,&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"src",&local_99);
  ctemplate::PathJoin(local_40,local_60);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"tests",&local_e1);
  ctemplate::PathJoin(local_c0,local_40);
  std::__cxx11::string::operator=(local_40,local_c0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"htmlparser_testdata",&local_129);
  ctemplate::PathJoin(local_108,local_40);
  std::__cxx11::string::operator=(local_40,local_108);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  ctemplate::PathJoin(local_150,local_40);
  __stream = _stderr;
  uVar2 = std::__cxx11::string::c_str();
  fprintf(__stream,"Validating %s",uVar2);
  std::__cxx11::string::string((string *)&start_html);
  filename_00 = (char *)std::__cxx11::string::c_str();
  ReadToString(filename_00,(string *)&start_html);
  start_annotation = 0;
  end_annotation = std::__cxx11::string::find((char *)&start_html,0x117004);
  local_188 = std::__cxx11::string::find((char *)&start_html,0x11700c);
  while( true ) {
    if (end_annotation == 0xffffffffffffffff) {
      std::__cxx11::string::~string((string *)&start_html);
      std::__cxx11::string::~string(local_150);
      std::__cxx11::string::~string(local_40);
      return;
    }
    std::__cxx11::string::string
              (local_1a8,(string *)&start_html,start_annotation,end_annotation - start_annotation);
    HtmlParser::Parse(&this->parser_,(string *)local_1a8);
    std::__cxx11::string::string
              (local_1c8,(string *)&start_html,end_annotation + 7,local_188 - (end_annotation + 7));
    ProcessAnnotation(this,(string *)local_1c8);
    iVar1 = HtmlParser::line_number(&this->parser_);
    iVar1 = UpdateLines((string *)local_1c8,iVar1);
    HtmlParser::set_line_number(&this->parser_,iVar1);
    iVar1 = HtmlParser::column_number(&this->parser_);
    iVar1 = UpdateColumns((string *)local_1c8,iVar1);
    HtmlParser::set_column_number(&this->parser_,iVar1);
    start_annotation = local_188 + 2;
    end_annotation = std::__cxx11::string::find((char *)&start_html,0x117004);
    local_188 = std::__cxx11::string::find((char *)&start_html,0x11700c);
    if ((end_annotation != 0xffffffffffffffff) && (local_188 == -1)) break;
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::string::~string(local_1a8);
  }
  fprintf(_stderr,"Check failed: %s\n",
          "!(start_annotation != string::npos && end_annotation == string::npos)");
  exit(1);
}

Assistant:

void HtmlparserCppTest::ValidateFile(string filename) {
  // If TEMPLATE_ROOTDIR is set in the environment, it overrides the
  // default of ".".  We use an env-var rather than argv because
  // that's what automake supports most easily.
  const char* template_rootdir = getenv("TEMPLATE_ROOTDIR");
  if (template_rootdir == NULL)
    template_rootdir = DEFAULT_TEMPLATE_ROOTDIR;   // probably "."
  string dir = PathJoin(template_rootdir, "src");
  dir = PathJoin(dir, "tests");
  dir = PathJoin(dir, "htmlparser_testdata");
  const string fullpath = PathJoin(dir, filename);
  fprintf(stderr, "Validating %s", fullpath.c_str());
  string buffer;
  ReadToString(fullpath.c_str(), &buffer);

  // Start of the current html block.
  size_t start_html = 0;

  // Start of the next annotation.
  size_t start_annotation = buffer.find(kDirectiveBegin, 0);

  // Ending of the current annotation.
  size_t end_annotation = buffer.find(kDirectiveEnd, start_annotation);

  while (start_annotation != string::npos) {
    string html_block(buffer, start_html, start_annotation - start_html);
    parser_.Parse(html_block);

    start_annotation += strlen(kDirectiveBegin);

    string annotation_block(buffer, start_annotation,
                            end_annotation - start_annotation);
    ProcessAnnotation(annotation_block);

    // Update line and column count.
    parser_.set_line_number(UpdateLines(annotation_block,
                                        parser_.line_number()));
    parser_.set_column_number(UpdateColumns(annotation_block,
                                            parser_.column_number()));

    start_html = end_annotation + strlen(kDirectiveEnd);
    start_annotation = buffer.find(kDirectiveBegin, start_html);
    end_annotation = buffer.find(kDirectiveEnd, start_annotation);

    // Check for unclosed annotation.
    CHECK(!(start_annotation != string::npos &&
            end_annotation == string::npos));
  }
}